

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void remove_property_insns(gen_ctx_t gen_ctx)

{
  MIR_insn_t pMVar1;
  MIR_insn_t next_insn;
  MIR_insn_t insn;
  gen_ctx_t gen_ctx_local;
  
  pMVar1 = DLIST_MIR_insn_t_head(&((gen_ctx->curr_func_item->u).func)->insns);
  while (next_insn = pMVar1, next_insn != (MIR_insn_t)0x0) {
    pMVar1 = DLIST_MIR_insn_t_next(next_insn);
    if ((((int)*(undefined8 *)&next_insn->field_0x18 == 0xb6) ||
        ((int)*(undefined8 *)&next_insn->field_0x18 == 0xb7)) ||
       ((int)*(undefined8 *)&next_insn->field_0x18 == 0xb8)) {
      remove_property_insn(gen_ctx,next_insn);
    }
  }
  return;
}

Assistant:

static void remove_property_insns (gen_ctx_t gen_ctx) {
  MIR_insn_t insn, next_insn;
  for (insn = DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns); insn != NULL;
       insn = next_insn) {
    next_insn = DLIST_NEXT (MIR_insn_t, insn);
    if (insn->code == MIR_PRSET || insn->code == MIR_PRBEQ || insn->code == MIR_PRBNE)
      remove_property_insn (gen_ctx, insn);
  }
}